

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5PoslistNext64(u8 *a,int n,int *pi,i64 *piOff)

{
  int iVar1;
  uint local_44;
  i64 iStack_40;
  int iVal;
  i64 iOff;
  i64 *piStack_30;
  int i;
  i64 *piOff_local;
  int *pi_local;
  u8 *puStack_18;
  int n_local;
  u8 *a_local;
  
  iOff._4_4_ = *pi;
  if (n <= iOff._4_4_) {
    *piOff = -1;
    return 1;
  }
  iStack_40 = *piOff;
  local_44 = (uint)a[iOff._4_4_];
  iVar1 = iOff._4_4_ + 1;
  piStack_30 = piOff;
  piOff_local = (i64 *)pi;
  pi_local._4_4_ = n;
  puStack_18 = a;
  if ((a[iOff._4_4_] & 0x80) != 0) {
    iVar1 = sqlite3Fts5GetVarint32(a + iOff._4_4_,&local_44);
    iVar1 = iVar1 + iOff._4_4_;
  }
  iOff._4_4_ = iVar1;
  if ((int)local_44 < 2) {
    if (local_44 == 0) {
      *(int *)piOff_local = iOff._4_4_;
      return 0;
    }
    local_44 = (uint)puStack_18[iOff._4_4_];
    iVar1 = iOff._4_4_ + 1;
    if ((puStack_18[iOff._4_4_] & 0x80) != 0) {
      iVar1 = sqlite3Fts5GetVarint32(puStack_18 + iOff._4_4_,&local_44);
      iVar1 = iVar1 + iOff._4_4_;
    }
    iOff._4_4_ = iVar1;
    iStack_40 = (long)(int)local_44 << 0x20;
    local_44 = (uint)puStack_18[iOff._4_4_];
    iVar1 = iOff._4_4_ + 1;
    if ((puStack_18[iOff._4_4_] & 0x80) != 0) {
      iVar1 = sqlite3Fts5GetVarint32(puStack_18 + iOff._4_4_,&local_44);
      iVar1 = iVar1 + iOff._4_4_;
    }
    iOff._4_4_ = iVar1;
    if ((int)local_44 < 2) {
      *piStack_30 = -1;
      return 1;
    }
  }
  *piStack_30 = iStack_40 + (int)(local_44 - 2 & 0x7fffffff);
  *(int *)piOff_local = iOff._4_4_;
  return 0;
}

Assistant:

static int sqlite3Fts5PoslistNext64(
  const u8 *a, int n,             /* Buffer containing poslist */
  int *pi,                        /* IN/OUT: Offset within a[] */
  i64 *piOff                      /* IN/OUT: Current offset */
){
  int i = *pi;
  if( i>=n ){
    /* EOF */
    *piOff = -1;
    return 1;  
  }else{
    i64 iOff = *piOff;
    int iVal;
    fts5FastGetVarint32(a, i, iVal);
    if( iVal<=1 ){
      if( iVal==0 ){
        *pi = i;
        return 0;
      }
      fts5FastGetVarint32(a, i, iVal);
      iOff = ((i64)iVal) << 32;
      fts5FastGetVarint32(a, i, iVal);
      if( iVal<2 ){
        /* This is a corrupt record. So stop parsing it here. */
        *piOff = -1;
        return 1;
      }
    }
    *piOff = iOff + ((iVal-2) & 0x7FFFFFFF);
    *pi = i;
    return 0;
  }
}